

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr_conflict ctxt,xmlDocPtr sourceDoc,xmlNodePtr node,
                       xmlNodePtr *resNode,xmlDocPtr destDoc,xmlNodePtr destParent,int deep,
                       int options)

{
  xmlElementType xVar1;
  _xmlDict *p_Var2;
  xmlNsPtr pxVar3;
  xmlNsMapItemPtr pxVar4;
  _xmlNs **pp_Var5;
  char cVar6;
  int iVar7;
  uint uVar8;
  xmlNodePtr pxVar9;
  xmlChar *pxVar10;
  xmlChar *pxVar11;
  xmlEntityPtr pxVar12;
  xmlNodePtr pxVar13;
  _xmlNode *p_Var14;
  xmlNsMapItemPtr_conflict pxVar15;
  _xmlDoc *p_Var16;
  xmlNsMapItemPtr pxVar17;
  _xmlNode *p_Var18;
  _xmlNode *p_Var19;
  _xmlNode *cur;
  int depth;
  int iVar20;
  xmlNsPtr *retNs;
  xmlNsMapPtr nsMap;
  xmlNodePtr *ppxVar21;
  xmlNsMapItemPtr local_90;
  xmlNodePtr local_88;
  xmlNodePtr local_80;
  xmlNsPtr local_78;
  xmlNodePtr local_70;
  xmlNodePtr local_68;
  ulong local_60;
  _xmlDoc *local_58;
  _xmlNode *local_50;
  undefined4 local_44;
  xmlChar *local_40;
  _xmlDict *local_38;
  
  local_90 = (xmlNsMapItemPtr_conflict)0x0;
  if ((destDoc != (xmlDocPtr)0x0 && (resNode != (xmlNodePtr *)0x0 && node != (xmlNodePtr)0x0)) &&
     ((destParent == (xmlNodePtr)0x0 || (destParent->doc == destDoc)))) {
    if (node->type != XML_ELEMENT_NODE) {
      return 1;
    }
    p_Var16 = node->doc;
    if (((p_Var16 == sourceDoc) || (sourceDoc == (xmlDocPtr)0x0)) || (p_Var16 == (_xmlDoc *)0x0)) {
      if (sourceDoc != (xmlDocPtr)0x0) {
        p_Var16 = sourceDoc;
      }
      iVar20 = -1;
      if (p_Var16 == (_xmlDoc *)0x0) {
        return -1;
      }
      if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
        local_90 = (xmlNsMapItemPtr)ctxt->namespaceMap;
      }
      p_Var2 = destDoc->dict;
      *resNode = (xmlNodePtr)0x0;
      ppxVar21 = resNode;
      if (node == (xmlNodePtr)0x0) {
        local_68 = (xmlNodePtr)0x0;
LAB_0014ff16:
        iVar20 = 0;
      }
      else {
        if (node->doc == p_Var16) {
          local_60 = 0;
          depth = -1;
          local_88 = (xmlNodePtr)0x0;
          local_68 = (xmlNodePtr)0x0;
          local_50 = (_xmlNode *)0x0;
          p_Var14 = (xmlNodePtr)0x0;
          cur = node;
          local_70 = destParent;
          local_58 = p_Var16;
          local_38 = p_Var2;
LAB_0014ff8c:
          p_Var18 = local_50;
          xVar1 = cur->type;
          if (XML_DOCUMENT_FRAG_NODE < xVar1) {
LAB_001507c9:
            iVar20 = -1;
            goto switchD_001500b1_caseD_6;
          }
          if ((0x9baU >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
            resNode = ppxVar21;
            if ((xVar1 != XML_ATTRIBUTE_NODE) ||
               (pxVar9 = (xmlNodePtr)(*xmlMalloc)(0x68), resNode = ppxVar21,
               pxVar9 == (_xmlNode *)0x0)) goto LAB_00150798;
            pxVar9->content = (xmlChar *)0x0;
            pxVar9->properties = (_xmlAttr *)0x0;
            pxVar9->doc = (_xmlDoc *)0x0;
            pxVar9->ns = (xmlNs *)0x0;
            pxVar9->next = (_xmlNode *)0x0;
            pxVar9->prev = (_xmlNode *)0x0;
            pxVar9->last = (_xmlNode *)0x0;
            pxVar9->parent = (_xmlNode *)0x0;
            pxVar9->name = (xmlChar *)0x0;
            pxVar9->children = (_xmlNode *)0x0;
            pxVar9->_private = (void *)0x0;
            *(undefined8 *)&pxVar9->type = 0;
            pxVar9->nsDef = (xmlNs *)0x0;
            if (local_68 == (xmlNodePtr)0x0) {
              local_68 = pxVar9;
            }
            else {
              pxVar9->parent = p_Var18;
              if (p_Var14 == (xmlNodePtr)0x0) {
                p_Var18->properties = (_xmlAttr *)pxVar9;
              }
              else {
                p_Var14->next = pxVar9;
                pxVar9->prev = p_Var14;
              }
            }
LAB_00150029:
            pxVar9->type = cur->type;
            pxVar9->doc = destDoc;
            pxVar11 = cur->name;
            pxVar10 = "text";
            local_80 = pxVar9;
            if (((pxVar11 == "text") || (pxVar10 = "textnoenc", pxVar11 == "textnoenc")) ||
               (pxVar10 = "comment", pxVar11 == "comment")) {
              pxVar9->name = pxVar10;
            }
            else if (pxVar11 != (xmlChar *)0x0) {
              if (local_38 == (xmlDictPtr)0x0) {
                pxVar11 = xmlStrdup(pxVar11);
              }
              else {
                pxVar11 = xmlDictLookup(local_38,pxVar11,-1);
              }
              local_80->name = pxVar11;
              ppxVar21 = resNode;
              if (pxVar11 == (xmlChar *)0x0) goto LAB_001507c9;
            }
            iVar20 = -1;
            ppxVar21 = resNode;
            pxVar9 = local_88;
            p_Var14 = local_80;
            switch(cur->type) {
            case XML_ELEMENT_NODE:
              goto switchD_001500b1_caseD_1;
            case XML_ATTRIBUTE_NODE:
              goto switchD_001500b1_caseD_2;
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
            case XML_PI_NODE:
            case XML_COMMENT_NODE:
              if (cur->content == (xmlChar *)0x0) goto joined_r0x0015064d;
              pxVar11 = xmlStrdup(cur->content);
              local_80->content = pxVar11;
              ppxVar21 = resNode;
              p_Var14 = local_80;
              if (pxVar11 != (xmlChar *)0x0) goto joined_r0x0015064d;
              goto switchD_001500b1_caseD_6;
            case XML_ENTITY_REF_NODE:
              if (local_58 == destDoc) {
                local_80->content = cur->content;
                local_80->children = cur->children;
                pxVar12 = (xmlEntityPtr)cur->last;
              }
              else {
                if ((destDoc->intSubset == (_xmlDtd *)0x0) && (destDoc->extSubset == (_xmlDtd *)0x0)
                   ) goto joined_r0x0015064d;
                pxVar12 = xmlGetDocEntity(destDoc,cur->name);
                p_Var14 = local_80;
                ppxVar21 = resNode;
                if (pxVar12 == (xmlEntityPtr)0x0) goto joined_r0x0015064d;
                local_80->content = pxVar12->content;
                local_80->children = (_xmlNode *)pxVar12;
              }
              local_80->last = (_xmlNode *)pxVar12;
              p_Var14 = local_80;
              ppxVar21 = resNode;
              goto joined_r0x0015064d;
            default:
              goto switchD_001500b1_caseD_6;
            case XML_XINCLUDE_START:
            case XML_XINCLUDE_END:
              return -1;
            }
          }
          pxVar9 = (xmlNodePtr)(*xmlMalloc)(0x78);
          resNode = ppxVar21;
          if (pxVar9 != (xmlNodePtr)0x0) {
            pxVar9->nsDef = (xmlNs *)0x0;
            pxVar9->psvi = (void *)0x0;
            pxVar9->content = (xmlChar *)0x0;
            pxVar9->properties = (_xmlAttr *)0x0;
            pxVar9->doc = (_xmlDoc *)0x0;
            pxVar9->ns = (xmlNs *)0x0;
            pxVar9->next = (_xmlNode *)0x0;
            pxVar9->prev = (_xmlNode *)0x0;
            pxVar9->last = (_xmlNode *)0x0;
            pxVar9->parent = (_xmlNode *)0x0;
            pxVar9->name = (xmlChar *)0x0;
            pxVar9->children = (_xmlNode *)0x0;
            pxVar9->_private = (void *)0x0;
            *(undefined8 *)&pxVar9->type = 0;
            pxVar9->line = 0;
            pxVar9->extra = 0;
            *(undefined4 *)&pxVar9->field_0x74 = 0;
            if (local_68 == (xmlNodePtr)0x0) {
              local_68 = pxVar9;
            }
            else {
              pxVar9->parent = p_Var18;
              if (p_Var14 == (xmlNodePtr)0x0) {
                p_Var18->children = pxVar9;
              }
              else {
                p_Var14->next = pxVar9;
                pxVar9->prev = p_Var14;
              }
              p_Var18->last = pxVar9;
            }
            goto LAB_00150029;
          }
LAB_00150798:
          iVar20 = -1;
          ppxVar21 = resNode;
          goto switchD_001500b1_caseD_6;
        }
        local_68 = (xmlNodePtr)0x0;
      }
switchD_001500b1_caseD_6:
      if (local_90 != (xmlNsMapItemPtr)0x0) {
        if ((ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) ||
           ((xmlNsMapItemPtr)ctxt->namespaceMap != local_90)) {
          resNode = ppxVar21;
          xmlDOMWrapNsMapFree((xmlNsMapPtr)local_90);
        }
        else if (local_90->next != (xmlNsMapItemPtr_conflict)0x0) {
          if ((xmlNsMapItemPtr_conflict)local_90->oldNs != (xmlNsMapItemPtr_conflict)0x0) {
            local_90->prev->next = (xmlNsMapItemPtr_conflict)local_90->oldNs;
          }
          local_90->oldNs = (xmlNsPtr)local_90->next;
          local_90->next = (xmlNsMapItemPtr_conflict)0x0;
        }
      }
      *resNode = local_68;
      return iVar20;
    }
  }
  return -1;
switchD_001500b1_caseD_1:
  depth = depth + 1;
  pxVar9 = local_80;
  if (cur->nsDef != (xmlNs *)0x0) {
    iVar7 = (int)local_60;
    local_60 = (ulong)(iVar7 + (uint)(iVar7 == 0));
    if ((iVar7 == 0 && ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) && local_70 != (xmlNodePtr)0x0) {
      iVar7 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_90,local_70);
      local_60 = 1;
      ppxVar21 = resNode;
      if (iVar7 == -1) goto switchD_001500b1_caseD_6;
    }
    local_78 = cur->nsDef;
    pxVar9 = local_80;
    if (cur->nsDef != (xmlNsPtr)0x0) {
      pxVar9 = (xmlNodePtr)&local_80->nsDef;
      do {
        pxVar13 = (xmlNodePtr)(*xmlMalloc)(0x30);
        if (pxVar13 == (xmlNodePtr)0x0) goto LAB_00150798;
        pxVar13->_private = (void *)0x0;
        *(undefined8 *)&pxVar13->type = 0;
        pxVar13->last = (_xmlNode *)0x0;
        pxVar13->parent = (_xmlNode *)0x0;
        pxVar13->name = (xmlChar *)0x0;
        pxVar13->children = (_xmlNode *)0x0;
        pxVar13->type = XML_NAMESPACE_DECL;
        local_88 = pxVar13;
        if (local_78->href != (xmlChar *)0x0) {
          pxVar11 = xmlStrdup(local_78->href);
          local_88->name = pxVar11;
          if (pxVar11 != (xmlChar *)0x0) goto LAB_0015021a;
          p_Var14 = local_88->children;
joined_r0x0015078a:
          if (p_Var14 != (_xmlNode *)0x0) {
            (*xmlFree)(p_Var14);
          }
          (*xmlFree)(local_88);
          goto LAB_00150798;
        }
LAB_0015021a:
        if (local_78->prefix != (xmlChar *)0x0) {
          p_Var14 = (_xmlNode *)xmlStrdup(local_78->prefix);
          local_88->children = p_Var14;
          if (p_Var14 == (_xmlNode *)0x0) {
            if (local_88->name != (xmlChar *)0x0) {
              (*xmlFree)(local_88->name);
            }
            p_Var14 = local_88->children;
            goto joined_r0x0015078a;
          }
        }
        pxVar9->_private = local_88;
        if ((ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) ||
           (pxVar9 = local_88, ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0)) {
          if (local_90 != (xmlNsMapItemPtr_conflict)0x0) {
            for (pxVar15 = local_90->next; pxVar15 != (xmlNsMapItemPtr_conflict)0x0;
                pxVar15 = pxVar15->next) {
              if ((-2 < pxVar15->depth) && (pxVar15->shadowDepth == -1)) {
                pxVar11 = pxVar15->newNs->prefix;
                if ((local_78->prefix == pxVar11) ||
                   (iVar7 = xmlStrEqual(local_78->prefix,pxVar11), iVar7 != 0)) {
                  pxVar15->shadowDepth = depth;
                }
              }
            }
          }
          pxVar9 = local_88;
          pxVar15 = xmlDOMWrapNsMapAddItem
                              ((xmlNsMapPtr *)&local_90,-1,local_78,(xmlNsPtr)local_88,depth);
          if (pxVar15 == (xmlNsMapItemPtr_conflict)0x0) {
            iVar20 = -1;
            ppxVar21 = resNode;
            goto switchD_001500b1_caseD_6;
          }
        }
        pp_Var5 = &local_78->next;
        local_78 = *pp_Var5;
      } while (*pp_Var5 != (_xmlNs *)0x0);
      local_88 = local_80;
      pxVar9 = local_88;
    }
  }
switchD_001500b1_caseD_2:
  local_88 = pxVar9;
  if (cur->ns != (xmlNs *)0x0) {
    iVar7 = (int)local_60;
    local_60 = (ulong)(iVar7 + (uint)(iVar7 == 0));
    if ((iVar7 == 0 && ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) && local_70 != (xmlNodePtr)0x0) {
      iVar7 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&local_90,local_70);
      local_60 = 1;
      ppxVar21 = resNode;
      if (iVar7 == -1) goto switchD_001500b1_caseD_6;
    }
    if (local_90 != (xmlNsMapItemPtr_conflict)0x0) {
      for (pxVar15 = local_90->next; pxVar15 != (xmlNsMapItemPtr_conflict)0x0;
          pxVar15 = pxVar15->next) {
        if ((pxVar15->shadowDepth == -1) && (cur->ns == pxVar15->oldNs)) {
          retNs = &pxVar15->newNs;
          goto LAB_001504b8;
        }
      }
    }
    if ((ctxt == (xmlDOMWrapCtxtPtr_conflict)0x0) ||
       (ctxt->getNsForNodeFunc == (xmlDOMWrapAcquireNsFunction)0x0)) {
      pxVar9 = local_88;
      if (local_70 == (xmlNodePtr)0x0) {
        pxVar9 = (xmlNodePtr)0x0;
      }
      retNs = &local_78;
      iVar7 = xmlDOMWrapNSNormAcquireNormalizedNs
                        (destDoc,pxVar9,cur->ns,retNs,(xmlNsMapPtr *)&local_90,depth,
                         (uint)(cur->type == XML_ATTRIBUTE_NODE),(int)resNode);
      ppxVar21 = resNode;
      if (iVar7 == -1) goto switchD_001500b1_caseD_6;
    }
    else {
      local_78 = (*ctxt->getNsForNodeFunc)(ctxt,cur,cur->ns->href,cur->ns->prefix);
      pxVar15 = xmlDOMWrapNsMapAddItem((xmlNsMapPtr *)&local_90,-1,cur->ns,local_78,-4);
      retNs = &local_78;
      ppxVar21 = resNode;
      if (pxVar15 == (xmlNsMapItemPtr_conflict)0x0) goto LAB_001507c9;
    }
LAB_001504b8:
    local_80->ns = *retNs;
  }
  if ((local_80->type == XML_ATTRIBUTE_NODE) && (local_80->parent != (xmlNodePtr)0x0)) {
    iVar7 = xmlIsID(destDoc,local_80->parent,(xmlAttrPtr)local_80);
    if (iVar7 < 0) {
      uVar8 = 4;
    }
    else {
      if (iVar7 == 1) {
        pxVar11 = xmlNodeGetContent(cur);
        if (pxVar11 == (xmlChar *)0x0) {
          uVar8 = 4;
          cVar6 = '\0';
        }
        else {
          local_40 = pxVar11;
          uVar8 = xmlAddIDSafe((xmlAttrPtr)cur,pxVar11);
          local_44 = CONCAT31((int3)(uVar8 >> 8),-1 < (int)uVar8);
          (*xmlFree)(local_40);
          cVar6 = (char)local_44;
          uVar8 = uVar8 >> 0x1d & 0xfffffffc;
        }
        if (cVar6 == '\0') goto LAB_001505fd;
      }
      uVar8 = 0;
    }
LAB_001505fd:
    if (uVar8 != 0) {
      ppxVar21 = resNode;
      if (uVar8 != 4) {
        return -1;
      }
      goto switchD_001500b1_caseD_6;
    }
  }
  p_Var14 = local_80;
  ppxVar21 = resNode;
  if ((cur->type != XML_ELEMENT_NODE) ||
     (p_Var18 = (_xmlNode *)cur->properties, p_Var19 = local_80, p_Var18 == (_xmlNode *)0x0)) {
    for (; (p_Var18 = cur->children, p_Var18 == (_xmlNode *)0x0 ||
           ((p_Var19 = p_Var14, deep == 0 && (cur->type != XML_ATTRIBUTE_NODE)))); cur = cur->parent
        ) {
joined_r0x0015064d:
      while( true ) {
        p_Var19 = local_50;
        local_50 = p_Var19;
        if (cur == node) goto LAB_0014ff16;
        xVar1 = cur->type;
        if ((xVar1 < (XML_XINCLUDE_END|XML_ELEMENT_NODE)) &&
           ((0x180002U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) {
          if ((local_90 != (xmlNsMapItemPtr_conflict)0x0) &&
             (local_90->next != (xmlNsMapItemPtr)0x0)) {
            pxVar3 = (xmlNsPtr)local_90->prev;
            while ((pxVar15 = local_90, pxVar3 != (xmlNsPtr)0x0 &&
                   (depth <= *(int *)((long)&pxVar3->_private + 4)))) {
              pxVar4 = *(xmlNsMapItemPtr *)&pxVar3->type;
              local_90->prev = pxVar4;
              pxVar17 = local_90;
              if (pxVar4 != (xmlNsMapItemPtr)0x0) {
                pxVar17 = pxVar4;
              }
              pxVar17->next = (xmlNsMapItemPtr_conflict)0x0;
              pxVar3->next = local_90->oldNs;
              local_90->oldNs = pxVar3;
              pxVar3 = (xmlNsPtr)local_90->prev;
            }
            while (pxVar15 = pxVar15->next, pxVar15 != (xmlNsMapItemPtr_conflict)0x0) {
              if (depth <= pxVar15->shadowDepth) {
                pxVar15->shadowDepth = -1;
              }
            }
          }
          depth = depth + -1;
        }
        p_Var18 = cur->next;
        if (p_Var18 != (_xmlNode *)0x0) goto LAB_00150716;
        p_Var14 = p_Var14->parent;
        if (xVar1 == XML_ATTRIBUTE_NODE) break;
        if (p_Var14 != (_xmlNode *)0x0) {
          local_50 = p_Var14->parent;
        }
        cur = cur->parent;
      }
      local_50 = p_Var14->parent;
    }
  }
  p_Var14 = (xmlNodePtr)0x0;
LAB_00150716:
  cur = p_Var18;
  local_50 = p_Var19;
  if (p_Var18->doc != local_58) goto switchD_001500b1_caseD_6;
  goto LAB_0014ff8c;
}

Assistant:

int
xmlDOMWrapCloneNode(xmlDOMWrapCtxtPtr ctxt,
		      xmlDocPtr sourceDoc,
		      xmlNodePtr node,
		      xmlNodePtr *resNode,
		      xmlDocPtr destDoc,
		      xmlNodePtr destParent,
		      int deep,
		      int options ATTRIBUTE_UNUSED)
{
    int ret = 0;
    xmlNodePtr cur, cloneElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr mi;
    xmlNsPtr ns;
    int depth = -1;
    /* int adoptStr = 1; */
    /* gather @parent's ns-decls. */
    int parnsdone = 0;
    /*
    * @ancestorsOnly:
    * TODO: @ancestorsOnly should be set per option.
    *
    */
    int ancestorsOnly = 0;
    xmlNodePtr resultClone = NULL, clone = NULL, parentClone = NULL, prevClone = NULL;
    xmlNsPtr cloneNs = NULL, *cloneNsDefSlot = NULL;
    xmlDictPtr dict; /* The destination dict */

    if ((node == NULL) || (resNode == NULL) || (destDoc == NULL) ||
	((destParent != NULL) && (destParent->doc != destDoc)))
	return(-1);
    /*
    * TODO: Initially we support only element-nodes.
    */
    if (node->type != XML_ELEMENT_NODE)
	return(1);
    /*
    * Check node->doc sanity.
    */
    if ((node->doc != NULL) && (sourceDoc != NULL) &&
	(node->doc != sourceDoc)) {
	/*
	* Might be an XIncluded node.
	*/
	return (-1);
    }
    if (sourceDoc == NULL)
	sourceDoc = node->doc;
    if (sourceDoc == NULL)
        return (-1);

    dict = destDoc->dict;
    /*
    * Reuse the namespace map of the context.
    */
    if (ctxt)
	nsMap = (xmlNsMapPtr) ctxt->namespaceMap;

    *resNode = NULL;

    cur = node;
    while (cur != NULL) {
	if (cur->doc != sourceDoc) {
	    /*
	    * We'll assume XIncluded nodes if the doc differs.
	    * TODO: Do we need to reconciliate XIncluded nodes?
	    * TODO: This here returns -1 in this case.
	    */
	    goto internal_error;
	}
	/*
	* Create a new node.
	*/
	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO: What to do with XInclude?
		*/
		goto internal_error;
		break;
	    case XML_ELEMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
	    case XML_DOCUMENT_FRAG_NODE:
	    case XML_ENTITY_REF_NODE:
		/*
		* Nodes of xmlNode structure.
		*/
		clone = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
		if (clone == NULL)
		    goto internal_error;
		memset(clone, 0, sizeof(xmlNode));
		/*
		* Set hierarchical links.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->children = clone;
                    parentClone->last = clone;
		} else
		    resultClone = clone;

		break;
	    case XML_ATTRIBUTE_NODE:
		/*
		* Attributes (xmlAttr).
		*/
		clone = xmlMalloc(sizeof(xmlAttr));
		if (clone == NULL)
		    goto internal_error;
		memset(clone, 0, sizeof(xmlAttr));
		/*
		* Set hierarchical links.
		* TODO: Change this to add to the end of attributes.
		*/
		if (resultClone != NULL) {
		    clone->parent = parentClone;
		    if (prevClone) {
			prevClone->next = clone;
			clone->prev = prevClone;
		    } else
			parentClone->properties = (xmlAttrPtr) clone;
		} else
		    resultClone = clone;
		break;
	    default:
		/*
		* TODO QUESTION: Any other nodes expected?
		*/
		goto internal_error;
	}

	clone->type = cur->type;
	clone->doc = destDoc;

	/*
	* Clone the name of the node if any.
	*/
	if (cur->name == xmlStringText)
	    clone->name = xmlStringText;
	else if (cur->name == xmlStringTextNoenc)
	    /*
	    * NOTE: Although xmlStringTextNoenc is never assigned to a node
	    *   in tree.c, it might be set in Libxslt via
	    *   "xsl:disable-output-escaping".
	    */
	    clone->name = xmlStringTextNoenc;
	else if (cur->name == xmlStringComment)
	    clone->name = xmlStringComment;
	else if (cur->name != NULL) {
            if (dict != NULL)
                clone->name = xmlDictLookup(dict, cur->name, -1);
            else
                clone->name = xmlStrdup(cur->name);
            if (clone->name == NULL)
                goto internal_error;
	}

	switch (cur->type) {
	    case XML_XINCLUDE_START:
	    case XML_XINCLUDE_END:
		/*
		* TODO
		*/
		return (-1);
	    case XML_ELEMENT_NODE:
		cloneElem = clone;
		depth++;
		/*
		* Namespace declarations.
		*/
		if (cur->nsDef != NULL) {
		    if (! parnsdone) {
			if (destParent && (ctxt == NULL)) {
			    /*
			    * Gather @parent's in-scope ns-decls.
			    */
			    if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				destParent) == -1)
				goto internal_error;
			}
			parnsdone = 1;
		    }
		    /*
		    * Clone namespace declarations.
		    */
		    cloneNsDefSlot = &(clone->nsDef);
		    for (ns = cur->nsDef; ns != NULL; ns = ns->next) {
			/*
			* Create a new xmlNs.
			*/
			cloneNs = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
			if (cloneNs == NULL)
			    goto internal_error;
			memset(cloneNs, 0, sizeof(xmlNs));
			cloneNs->type = XML_LOCAL_NAMESPACE;

			if (ns->href != NULL) {
			    cloneNs->href = xmlStrdup(ns->href);
                            if (cloneNs->href == NULL) {
                                xmlFreeNs(cloneNs);
                                goto internal_error;
                            }
                        }
			if (ns->prefix != NULL) {
			    cloneNs->prefix = xmlStrdup(ns->prefix);
                            if (cloneNs->prefix == NULL) {
                                xmlFreeNs(cloneNs);
                                goto internal_error;
                            }
                        }

			*cloneNsDefSlot = cloneNs;
			cloneNsDefSlot = &(cloneNs->next);

			/*
			* Note that for custom handling of ns-references,
			* the ns-decls need not be stored in the ns-map,
			* since they won't be referenced by node->ns.
			*/
			if ((ctxt == NULL) ||
			    (ctxt->getNsForNodeFunc == NULL))
			{
			    /*
			    * Does it shadow any ns-decl?
			    */
			    if (XML_NSMAP_NOTEMPTY(nsMap)) {
				XML_NSMAP_FOREACH(nsMap, mi) {
				    if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
					(mi->shadowDepth == -1) &&
					((ns->prefix == mi->newNs->prefix) ||
					xmlStrEqual(ns->prefix,
					mi->newNs->prefix))) {
					/*
					* Mark as shadowed at the current
					* depth.
					*/
					mi->shadowDepth = depth;
				    }
				}
			    }
			    /*
			    * Push mapping.
			    */
			    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
				ns, cloneNs, depth) == NULL)
				goto internal_error;
			}
		    }
		}
		/* cur->ns will be processed further down. */
		break;
	    case XML_ATTRIBUTE_NODE:
		/* IDs will be processed further down. */
		/* cur->ns will be processed further down. */
		break;
	    case XML_PI_NODE:
	    case XML_COMMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
		/*
		* Note that this will also cover the values of attributes.
		*/
                if (cur->content != NULL) {
                    clone->content = xmlStrdup(cur->content);
                    if (clone->content == NULL)
                        goto internal_error;
                }
		goto leave_node;
	    case XML_ENTITY_REF_NODE:
		if (sourceDoc != destDoc) {
		    if ((destDoc->intSubset) || (destDoc->extSubset)) {
			xmlEntityPtr ent;
			/*
			* Different doc: Assign new entity-node if available.
			*/
			ent = xmlGetDocEntity(destDoc, cur->name);
			if (ent != NULL) {
			    clone->content = ent->content;
			    clone->children = (xmlNodePtr) ent;
			    clone->last = (xmlNodePtr) ent;
			}
		    }
		} else {
		    /*
		    * Same doc: Use the current node's entity declaration
		    * and value.
		    */
		    clone->content = cur->content;
		    clone->children = cur->children;
		    clone->last = cur->last;
		}
		goto leave_node;
	    default:
		goto internal_error;
	}

	if (cur->ns == NULL)
	    goto end_ns_reference;

/* handle_ns_reference: */
	/*
	** The following will take care of references to ns-decls ********
	** and is intended only for element- and attribute-nodes.
	**
	*/
	if (! parnsdone) {
	    if (destParent && (ctxt == NULL)) {
		if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap, destParent) == -1)
		    goto internal_error;
	    }
	    parnsdone = 1;
	}
	/*
	* Adopt ns-references.
	*/
	if (XML_NSMAP_NOTEMPTY(nsMap)) {
	    /*
	    * Search for a mapping.
	    */
	    XML_NSMAP_FOREACH(nsMap, mi) {
		if ((mi->shadowDepth == -1) &&
		    (cur->ns == mi->oldNs)) {
		    /*
		    * This is the nice case: a mapping was found.
		    */
		    clone->ns = mi->newNs;
		    goto end_ns_reference;
		}
	    }
	}
	/*
	* No matching namespace in scope. We need a new one.
	*/
	if ((ctxt != NULL) && (ctxt->getNsForNodeFunc != NULL)) {
	    /*
	    * User-defined behaviour.
	    */
	    ns = ctxt->getNsForNodeFunc(ctxt, cur,
		cur->ns->href, cur->ns->prefix);
	    /*
	    * Add user's mapping.
	    */
	    if (xmlDOMWrapNsMapAddItem(&nsMap, -1,
		cur->ns, ns, XML_TREE_NSMAP_CUSTOM) == NULL)
		goto internal_error;
	    clone->ns = ns;
	} else {
	    /*
	    * Acquire a normalized ns-decl and add it to the map.
	    */
	    if (xmlDOMWrapNSNormAcquireNormalizedNs(destDoc,
		/* ns-decls on cloneElem or on destDoc->oldNs */
		destParent ? cloneElem : NULL,
		cur->ns, &ns,
		&nsMap, depth,
		/* if we need to search only in the ancestor-axis */
		ancestorsOnly,
		/* ns-decls must be prefixed for attributes. */
		(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
		goto internal_error;
	    clone->ns = ns;
	}

end_ns_reference:

	/*
	* Some post-processing.
	*
	* Handle ID attributes.
	*/
	if ((clone->type == XML_ATTRIBUTE_NODE) &&
	    (clone->parent != NULL))
	{
            int res;

	    res = xmlIsID(destDoc, clone->parent, (xmlAttrPtr) clone);
            if (res < 0)
                goto internal_error;
            if (res == 1) {
		xmlChar *idVal;

		idVal = xmlNodeGetContent(cur);
                if (idVal == NULL)
                    goto internal_error;
                if (xmlAddIDSafe((xmlAttrPtr) cur, idVal) < 0) {
                    xmlFree(idVal);
                    goto internal_error;
                }
                xmlFree(idVal);
	    }
	}
	/*
	**
	** The following will traverse the tree **************************
	**
	*
	* Walk the element's attributes before descending into child-nodes.
	*/
	if ((cur->type == XML_ELEMENT_NODE) && (cur->properties != NULL)) {
	    prevClone = NULL;
	    parentClone = clone;
	    cur = (xmlNodePtr) cur->properties;
	    continue;
	}
into_content:
	/*
	* Descend into child-nodes.
	*/
	if (cur->children != NULL) {
	    if (deep || (cur->type == XML_ATTRIBUTE_NODE)) {
		prevClone = NULL;
		parentClone = clone;
		cur = cur->children;
		continue;
	    }
	}

leave_node:
	/*
	* At this point we are done with the node, its content
	* and an element-nodes's attribute-nodes.
	*/
	if (cur == node)
	    break;
	if ((cur->type == XML_ELEMENT_NODE) ||
	    (cur->type == XML_XINCLUDE_START) ||
	    (cur->type == XML_XINCLUDE_END)) {
	    /*
	    * TODO: Do we expect nsDefs on XML_XINCLUDE_START?
	    */
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL) {
	    prevClone = clone;
	    cur = cur->next;
	} else if (cur->type != XML_ATTRIBUTE_NODE) {
	    clone = clone->parent;
	    if (clone != NULL)
		parentClone = clone->parent;
	    /*
	    * Process parent --> next;
	    */
	    cur = cur->parent;
	    goto leave_node;
	} else {
	    /* This is for attributes only. */
	    clone = clone->parent;
	    parentClone = clone->parent;
	    /*
	    * Process parent-element --> children.
	    */
	    cur = cur->parent;
	    goto into_content;
	}
    }
    goto exit;

internal_error:
    ret = -1;

exit:
    /*
    * Cleanup.
    */
    if (nsMap != NULL) {
	if ((ctxt) && (ctxt->namespaceMap == nsMap)) {
	    /*
	    * Just cleanup the map but don't free.
	    */
	    if (nsMap->first) {
		if (nsMap->pool)
		    nsMap->last->next = nsMap->pool;
		nsMap->pool = nsMap->first;
		nsMap->first = NULL;
	    }
	} else
	    xmlDOMWrapNsMapFree(nsMap);
    }
    /*
    * TODO: Should we try a cleanup of the cloned node in case of a
    * fatal error?
    */
    *resNode = resultClone;
    return (ret);
}